

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_hlsl_resource_binding_init(spvc_hlsl_resource_binding *binding)

{
  undefined1 local_3c [8];
  HLSLResourceBinding binding_default;
  spvc_hlsl_resource_binding *binding_local;
  
  binding_default.sampler = (Binding)binding;
  spirv_cross::HLSLResourceBinding::HLSLResourceBinding((HLSLResourceBinding *)local_3c);
  *(undefined4 *)((long)binding_default.sampler + 4) = local_3c._4_4_;
  *(ExecutionModel *)((long)binding_default.sampler + 8) = binding_default.stage;
  *(uint32_t *)((long)binding_default.sampler + 0x10) = binding_default.binding;
  *(uint32_t *)((long)binding_default.sampler + 0xc) = binding_default.desc_set;
  *(uint32_t *)((long)binding_default.sampler + 0x20) = binding_default.uav.register_binding;
  *(uint32_t *)((long)binding_default.sampler + 0x1c) = binding_default.uav.register_space;
  *(uint32_t *)((long)binding_default.sampler + 0x18) = binding_default.cbv.register_binding;
  *(uint32_t *)((long)binding_default.sampler + 0x14) = binding_default.cbv.register_space;
  *(uint32_t *)((long)binding_default.sampler + 0x28) = binding_default.srv.register_binding;
  *(uint32_t *)((long)binding_default.sampler + 0x24) = binding_default.srv.register_space;
  *(undefined4 *)binding_default.sampler = local_3c._0_4_;
  return;
}

Assistant:

void spvc_hlsl_resource_binding_init(spvc_hlsl_resource_binding *binding)
{
#if SPIRV_CROSS_C_API_HLSL
	HLSLResourceBinding binding_default;
	binding->desc_set = binding_default.desc_set;
	binding->binding = binding_default.binding;
	binding->cbv.register_binding = binding_default.cbv.register_binding;
	binding->cbv.register_space = binding_default.cbv.register_space;
	binding->srv.register_binding = binding_default.srv.register_binding;
	binding->srv.register_space = binding_default.srv.register_space;
	binding->uav.register_binding = binding_default.uav.register_binding;
	binding->uav.register_space = binding_default.uav.register_space;
	binding->sampler.register_binding = binding_default.sampler.register_binding;
	binding->sampler.register_space = binding_default.sampler.register_space;
	binding->stage = static_cast<SpvExecutionModel>(binding_default.stage);
#else
	memset(binding, 0, sizeof(*binding));
#endif
}